

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<rtripProblems_rtripFiles_Test>::CreateTest
          (ParameterizedTestFactory<rtripProblems_rtripFiles_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<int>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  rtripProblems_rtripFiles_Test::rtripProblems_rtripFiles_Test
            ((rtripProblems_rtripFiles_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }